

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O1

VP8StatusCode IDecode(WebPIDecoder *idec)

{
  VP8Io *pVVar1;
  size_t *psVar2;
  VP8BitReader *token_br;
  VP8BitReader *pVVar3;
  uint8_t **ppuVar4;
  VP8MB VVar5;
  VP8MB VVar6;
  WebPDecBuffer *pWVar7;
  void *pvVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  undefined8 uVar13;
  bool bVar14;
  int iVar15;
  VP8StatusCode VVar16;
  int iVar17;
  VP8LDecoder *pVVar18;
  size_t sVar19;
  VP8Decoder *pVVar20;
  uint8_t *puVar21;
  WebPWorkerInterface *pWVar22;
  uint uVar23;
  DecState DVar24;
  VP8Decoder *dec;
  VP8StatusCode VVar25;
  size_t sVar26;
  uint3 *data;
  ulong uVar27;
  int height;
  int width;
  VP8StatusCode local_9c;
  int local_7c;
  WebPHeaderStructure local_78;
  
  if (idec->state_ == STATE_WEBP_HEADER) {
    local_78.data_size = (idec->mem_).start_;
    local_78.data = (idec->mem_).buf_ + local_78.data_size;
    local_78.data_size = (idec->mem_).end_ - local_78.data_size;
    local_78.have_all_data = 0;
    VVar16 = WebPParseHeaders(&local_78);
    if (VVar16 == VP8_STATUS_OK) {
      idec->chunk_size_ =
           CONCAT44(local_78.compressed_size._4_4_,(undefined4)local_78.compressed_size);
      idec->is_lossless_ = local_78.is_lossless;
      if (local_78.is_lossless == 0) {
        pVVar20 = VP8New();
        if (pVVar20 == (VP8Decoder *)0x0) goto LAB_0010b66e;
        idec->dec_ = pVVar20;
        pVVar20->alpha_data_ =
             (uint8_t *)CONCAT44(local_78.alpha_data._4_4_,local_78.alpha_data._0_4_);
        pVVar20->alpha_data_size_ =
             CONCAT44(local_78.alpha_data_size._4_4_,(undefined4)local_78.alpha_data_size);
        sVar26 = (idec->mem_).end_;
        sVar19 = (idec->mem_).start_ + CONCAT44(local_78.offset._4_4_,(undefined4)local_78.offset);
        idec->state_ = STATE_VP8_HEADER;
      }
      else {
        pVVar18 = VP8LNew();
        if (pVVar18 == (VP8LDecoder *)0x0) {
LAB_0010b66e:
          VVar25 = VP8_STATUS_OUT_OF_MEMORY;
          goto LAB_0010b674;
        }
        idec->dec_ = pVVar18;
        sVar26 = (idec->mem_).end_;
        sVar19 = (idec->mem_).start_ + CONCAT44(local_78.offset._4_4_,(undefined4)local_78.offset);
        idec->state_ = STATE_VP8L_HEADER;
      }
      (idec->mem_).start_ = sVar19;
      (idec->io_).data = (idec->mem_).buf_ + sVar19;
      (idec->io_).data_size = sVar26 - sVar19;
      VVar25 = VP8_STATUS_OK;
    }
    else {
      VVar25 = VP8_STATUS_SUSPENDED;
      if (VVar16 != VP8_STATUS_NOT_ENOUGH_DATA) {
        if (idec->state_ == STATE_VP8_DATA) {
          VP8ExitCritical((VP8Decoder *)idec->dec_,&idec->io_);
        }
        idec->state_ = STATE_ERROR;
        VVar25 = VVar16;
      }
    }
  }
  else {
    VVar25 = VP8_STATUS_SUSPENDED;
    if (idec->dec_ == (void *)0x0) {
      return VP8_STATUS_SUSPENDED;
    }
  }
LAB_0010b674:
  if (idec->state_ == STATE_VP8_HEADER) {
    sVar26 = (idec->mem_).start_;
    uVar27 = (idec->mem_).end_ - sVar26;
    VVar25 = VP8_STATUS_SUSPENDED;
    if (9 < uVar27) {
      data = (uint3 *)((idec->mem_).buf_ + sVar26);
      iVar15 = VP8GetInfo((uint8_t *)data,uVar27,idec->chunk_size_,(int *)&local_78,&local_7c);
      if (iVar15 == 0) {
        VVar25 = VP8_STATUS_BITSTREAM_ERROR;
        DVar24 = STATE_ERROR;
        if (idec->state_ == STATE_VP8_DATA) {
          VP8ExitCritical((VP8Decoder *)idec->dec_,&idec->io_);
        }
      }
      else {
        (idec->mem_).part0_size_ = (ulong)((*data >> 5) + 10);
        (idec->io_).data = (uint8_t *)data;
        (idec->io_).data_size = uVar27;
        VVar25 = VP8_STATUS_OK;
        DVar24 = STATE_VP8_PARTS0;
      }
      idec->state_ = DVar24;
    }
  }
  if ((idec->state_ != STATE_VP8_PARTS0) ||
     (VVar25 = VP8_STATUS_SUSPENDED,
     (idec->mem_).end_ - (idec->mem_).start_ < (idec->mem_).part0_size_)) goto LAB_0010b898;
  pWVar7 = (idec->params_).output;
  pVVar20 = (VP8Decoder *)idec->dec_;
  pVVar1 = &idec->io_;
  iVar15 = VP8GetHeaders(pVVar20,pVVar1);
  if (iVar15 == 0) {
    VVar16 = pVVar20->status_;
    if ((VVar16 & ~VP8_STATUS_INVALID_PARAM) == VP8_STATUS_SUSPENDED) goto LAB_0010b898;
  }
  else {
    VVar16 = WebPAllocateDecBuffer
                       ((idec->io_).width,(idec->io_).height,(idec->params_).options,pWVar7);
    pVVar20->status_ = VVar16;
    if (VVar16 == VP8_STATUS_OK) {
      bVar14 = false;
      iVar15 = VP8GetThreadMethod((idec->params_).options,(WebPHeaderStructure *)0x0,
                                  (idec->io_).width,(idec->io_).height);
      pVVar20->mt_method_ = iVar15;
      VP8InitDithering((idec->params_).options,pVVar20);
      pvVar8 = idec->dec_;
      sVar26 = *(long *)((long)pvVar8 + 0x28) - *(long *)((long)pvVar8 + 0x20);
      if (sVar26 == 0) {
        VVar16 = VP8_STATUS_BITSTREAM_ERROR;
      }
      else {
        if ((idec->mem_).mode_ == MEM_MODE_APPEND) {
          puVar21 = (uint8_t *)WebPSafeMalloc(1,sVar26);
          if (puVar21 == (uint8_t *)0x0) {
            VVar16 = VP8_STATUS_OUT_OF_MEMORY;
            bVar14 = false;
            goto LAB_0010b85c;
          }
          memcpy(puVar21,*(void **)((long)pvVar8 + 0x20),sVar26);
          (idec->mem_).part0_buf_ = puVar21;
          VP8BitReaderSetBuffer((VP8BitReader *)((long)pvVar8 + 0x10),puVar21,sVar26);
        }
        psVar2 = &(idec->mem_).start_;
        *psVar2 = *psVar2 + sVar26;
        VVar16 = VP8_STATUS_OK;
        bVar14 = true;
      }
LAB_0010b85c:
      pVVar20->status_ = VVar16;
      if (bVar14) {
        VVar16 = VP8EnterCritical(pVVar20,pVVar1);
        if (VVar16 == VP8_STATUS_OK) {
          idec->state_ = STATE_VP8_DATA;
          iVar15 = VP8InitFrame(pVVar20,pVVar1);
          VVar25 = VP8_STATUS_OK;
          if (iVar15 != 0) goto LAB_0010b898;
        }
        VVar16 = pVVar20->status_;
      }
    }
  }
  if (idec->state_ == STATE_VP8_DATA) {
    VP8ExitCritical((VP8Decoder *)idec->dec_,pVVar1);
  }
  idec->state_ = STATE_ERROR;
  VVar25 = VVar16;
LAB_0010b898:
  if (idec->state_ == STATE_VP8_DATA) {
    pVVar20 = (VP8Decoder *)idec->dec_;
    if (pVVar20 != (VP8Decoder *)0x0) {
      pVVar1 = &idec->io_;
      dec = pVVar20;
      if (pVVar20->ready_ == 0) {
LAB_0010bafb:
        VP8ExitCritical(dec,pVVar1);
LAB_0010bb03:
        idec->state_ = STATE_ERROR;
        VVar25 = VP8_STATUS_BITSTREAM_ERROR;
      }
      else {
        iVar15 = pVVar20->mb_y_;
        if (iVar15 < pVVar20->mb_h_) {
          do {
            if (idec->last_mb_y_ != iVar15) {
              iVar15 = VP8ParseIntraModeRow(&pVVar20->br_,pVVar20);
              if (iVar15 == 0) {
                if (idec->state_ != STATE_VP8_DATA) goto LAB_0010bb03;
                dec = (VP8Decoder *)idec->dec_;
                goto LAB_0010bafb;
              }
              idec->last_mb_y_ = pVVar20->mb_y_;
            }
            iVar15 = pVVar20->mb_x_;
            while (iVar15 < pVVar20->mb_w_) {
              uVar23 = pVVar20->num_parts_minus_one_ & pVVar20->mb_y_;
              token_br = pVVar20->parts_ + uVar23;
              VVar5 = pVVar20->mb_info_[-1];
              VVar6 = pVVar20->mb_info_[iVar15];
              pVVar3 = pVVar20->parts_ + uVar23;
              uVar9 = pVVar3->range_;
              uVar10 = pVVar3->bits_;
              ppuVar4 = &pVVar20->parts_[uVar23].buf_;
              puVar21 = *ppuVar4;
              puVar11 = ppuVar4[1];
              ppuVar4 = &pVVar20->parts_[uVar23].buf_max_;
              puVar12 = *ppuVar4;
              uVar13 = ppuVar4[1];
              local_78.alpha_data._4_4_ = SUB84(puVar12,0);
              local_78.alpha_data_size._0_4_ = (undefined4)((ulong)puVar12 >> 0x20);
              local_78.alpha_data_size._4_4_ = (undefined4)uVar13;
              local_78.compressed_size._0_4_ = (undefined4)((ulong)uVar13 >> 0x20);
              local_78._20_4_ = SUB84(puVar21,0);
              local_78.offset._0_4_ = (undefined4)((ulong)puVar21 >> 0x20);
              local_78.offset._4_4_ = SUB84(puVar11,0);
              local_78.alpha_data._0_4_ = (undefined4)((ulong)puVar11 >> 0x20);
              local_78.data._4_4_ = (undefined4)pVVar3->value_;
              local_78.data_size._0_4_ = (undefined4)(pVVar3->value_ >> 0x20);
              local_78.data_size._4_4_ = uVar9;
              local_78.have_all_data = uVar10;
              iVar15 = VP8DecodeMB(pVVar20,token_br);
              if (iVar15 == 0) {
                if ((pVVar20->num_parts_minus_one_ == 0) &&
                   (0x1000 < (idec->mem_).end_ - (idec->mem_).start_)) {
LAB_0010ba66:
                  if (idec->state_ == STATE_VP8_DATA) {
                    VP8ExitCritical((VP8Decoder *)idec->dec_,pVVar1);
                  }
                  idec->state_ = STATE_ERROR;
                  local_9c = VP8_STATUS_BITSTREAM_ERROR;
                }
                else {
                  if (0 < pVVar20->mt_method_) {
                    pWVar22 = WebPGetWorkerInterface();
                    iVar17 = (*pWVar22->Sync)(&pVVar20->worker_);
                    if (iVar17 == 0) goto LAB_0010ba66;
                  }
                  pVVar20->mb_info_[-1] = VVar5;
                  pVVar20->mb_info_[pVVar20->mb_x_] = VVar6;
                  token_br->buf_max_ =
                       (uint8_t *)
                       CONCAT44((undefined4)local_78.alpha_data_size,local_78.alpha_data._4_4_);
                  *(ulong *)&token_br->eof_ =
                       CONCAT44((undefined4)local_78.compressed_size,local_78.alpha_data_size._4_4_)
                  ;
                  token_br->buf_ = (uint8_t *)CONCAT44((undefined4)local_78.offset,local_78._20_4_);
                  token_br->buf_end_ =
                       (uint8_t *)CONCAT44(local_78.alpha_data._0_4_,local_78.offset._4_4_);
                  token_br->value_ = CONCAT44((undefined4)local_78.data_size,local_78.data._4_4_);
                  token_br->range_ = local_78.data_size._4_4_;
                  token_br->bits_ = local_78.have_all_data;
                  local_9c = VP8_STATUS_SUSPENDED;
                }
              }
              else if (pVVar20->num_parts_minus_one_ == 0) {
                (idec->mem_).start_ = (long)token_br->buf_ - (long)(idec->mem_).buf_;
              }
              VVar25 = local_9c;
              if (iVar15 == 0) goto LAB_0010bb5c;
              iVar15 = pVVar20->mb_x_ + 1;
              pVVar20->mb_x_ = iVar15;
            }
            VP8InitScanline(pVVar20);
            iVar15 = VP8ProcessRow(pVVar20,pVVar1);
            if (iVar15 == 0) {
              if (idec->state_ == STATE_VP8_DATA) {
                VP8ExitCritical((VP8Decoder *)idec->dec_,pVVar1);
              }
              goto LAB_0010bb4f;
            }
            iVar15 = pVVar20->mb_y_ + 1;
            pVVar20->mb_y_ = iVar15;
            if (pVVar20->mb_h_ <= iVar15) break;
          } while( true );
        }
        iVar15 = VP8ExitCritical(pVVar20,pVVar1);
        if (iVar15 == 0) {
LAB_0010bb4f:
          idec->state_ = STATE_ERROR;
          VVar25 = VP8_STATUS_USER_ABORT;
        }
        else {
          pVVar20->ready_ = 0;
          VVar25 = FinishDecoding(idec);
        }
      }
    }
LAB_0010bb5c:
    if (pVVar20 == (VP8Decoder *)0x0) {
      return VP8_STATUS_SUSPENDED;
    }
  }
  if (idec->state_ == STATE_VP8L_HEADER) {
    uVar27 = (idec->mem_).end_ - (idec->mem_).start_;
    pVVar18 = (VP8LDecoder *)idec->dec_;
    if (uVar27 < idec->chunk_size_ >> 3) {
      pVVar18->status_ = VP8_STATUS_SUSPENDED;
      VVar25 = VP8_STATUS_SUSPENDED;
    }
    else {
      pVVar1 = &idec->io_;
      pWVar7 = (idec->params_).output;
      iVar15 = VP8LDecodeHeader(pVVar18,pVVar1);
      if (iVar15 == 0) {
        if ((pVVar18->status_ == VP8_STATUS_BITSTREAM_ERROR) && (uVar27 < idec->chunk_size_)) {
          pVVar18->status_ = VP8_STATUS_SUSPENDED;
        }
        VVar16 = pVVar18->status_;
        VVar25 = VP8_STATUS_SUSPENDED;
        if ((VVar16 & ~VP8_STATUS_INVALID_PARAM) != VP8_STATUS_SUSPENDED) {
          if (idec->state_ == STATE_VP8_DATA) {
            VP8ExitCritical((VP8Decoder *)idec->dec_,pVVar1);
          }
          idec->state_ = STATE_ERROR;
          VVar25 = VVar16;
        }
      }
      else {
        VVar25 = WebPAllocateDecBuffer
                           ((idec->io_).width,(idec->io_).height,(idec->params_).options,pWVar7);
        pVVar18->status_ = VVar25;
        if (VVar25 == VP8_STATUS_OK) {
          idec->state_ = STATE_VP8L_DATA;
          VVar25 = VP8_STATUS_OK;
        }
        else {
          if (idec->state_ == STATE_VP8_DATA) {
            VP8ExitCritical((VP8Decoder *)idec->dec_,pVVar1);
          }
          idec->state_ = STATE_ERROR;
        }
      }
    }
  }
  if (idec->state_ == STATE_VP8L_DATA) {
    pVVar18 = (VP8LDecoder *)idec->dec_;
    pVVar18->incremental_ = (uint)((idec->mem_).end_ - (idec->mem_).start_ < idec->chunk_size_);
    iVar15 = VP8LDecodeImage(pVVar18);
    VVar16 = pVVar18->status_;
    if (iVar15 == 0) {
      VVar25 = VP8_STATUS_SUSPENDED;
      if ((VVar16 & ~VP8_STATUS_INVALID_PARAM) != VP8_STATUS_SUSPENDED) {
        if (idec->state_ == STATE_VP8_DATA) {
          VP8ExitCritical((VP8Decoder *)idec->dec_,&idec->io_);
        }
        idec->state_ = STATE_ERROR;
        VVar25 = VVar16;
      }
    }
    else {
      VVar25 = VP8_STATUS_SUSPENDED;
      if (VVar16 != VP8_STATUS_SUSPENDED) {
        VVar25 = FinishDecoding(idec);
      }
    }
  }
  return VVar25;
}

Assistant:

static VP8StatusCode IDecode(WebPIDecoder* idec) {
  VP8StatusCode status = VP8_STATUS_SUSPENDED;

  if (idec->state_ == STATE_WEBP_HEADER) {
    status = DecodeWebPHeaders(idec);
  } else {
    if (idec->dec_ == NULL) {
      return VP8_STATUS_SUSPENDED;    // can't continue if we have no decoder.
    }
  }
  if (idec->state_ == STATE_VP8_HEADER) {
    status = DecodeVP8FrameHeader(idec);
  }
  if (idec->state_ == STATE_VP8_PARTS0) {
    status = DecodePartition0(idec);
  }
  if (idec->state_ == STATE_VP8_DATA) {
    const VP8Decoder* const dec = (VP8Decoder*)idec->dec_;
    if (dec == NULL) {
      return VP8_STATUS_SUSPENDED;  // can't continue if we have no decoder.
    }
    status = DecodeRemaining(idec);
  }
  if (idec->state_ == STATE_VP8L_HEADER) {
    status = DecodeVP8LHeader(idec);
  }
  if (idec->state_ == STATE_VP8L_DATA) {
    status = DecodeVP8LData(idec);
  }
  return status;
}